

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O0

bool bssl::parse_server_hello_tls13
               (SSL_HANDSHAKE *hs,ParsedServerHello *out,uint8_t *out_alert,SSLMessage *msg)

{
  Span<const_unsigned_char> rhs;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Span<const_unsigned_char> lhs;
  undefined1 local_48 [8];
  Span<const_unsigned_char> expected_session_id;
  uint16_t expected_version;
  SSLMessage *msg_local;
  uint8_t *out_alert_local;
  ParsedServerHello *out_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = ssl_parse_server_hello(out,out_alert,msg);
  if (bVar1) {
    iVar2 = SSL_is_dtls(hs->ssl);
    expected_session_id.size_._6_2_ = 0x303;
    if (iVar2 != 0) {
      expected_session_id.size_._6_2_ = 0xfefd;
    }
    iVar2 = SSL_is_dtls(hs->ssl);
    if (iVar2 == 0) {
      Span<unsigned_char_const>::
      Span<bssl::InplaceVector<unsigned_char,32ul>,void,bssl::InplaceVector<unsigned_char,32ul>>
                ((Span<unsigned_char_const> *)local_48,&hs->session_id);
    }
    else {
      Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_48);
    }
    if ((out->legacy_version == expected_session_id.size_._6_2_) &&
       (out->compression_method == '\0')) {
      lhs = cbs_st::operator_cast_to_Span(&out->session_id);
      rhs.size_ = (size_t)expected_session_id.data_;
      rhs.data_ = (uchar *)local_48;
      bVar1 = internal::operator!=(lhs,rhs);
      if ((!bVar1) && (sVar3 = CBS_len(&out->extensions), sVar3 != 0)) {
        return true;
      }
    }
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x80);
    *out_alert = '2';
  }
  return false;
}

Assistant:

static bool parse_server_hello_tls13(const SSL_HANDSHAKE *hs,
                                     ParsedServerHello *out, uint8_t *out_alert,
                                     const SSLMessage &msg) {
  if (!ssl_parse_server_hello(out, out_alert, msg)) {
    return false;
  }
  uint16_t expected_version =
      SSL_is_dtls(hs->ssl) ? DTLS1_2_VERSION : TLS1_2_VERSION;
  // DTLS 1.3 disables "compatibility mode" (RFC 8446, appendix D.4). When
  // disabled, servers MUST NOT echo the legacy_session_id (RFC 9147, section
  // 5). The client could have sent a session ID indicating its willingness to
  // resume a DTLS 1.2 session, so just checking that the session IDs match is
  // incorrect.
  Span<const uint8_t> expected_session_id =
      SSL_is_dtls(hs->ssl) ? Span<const uint8_t>() : Span(hs->session_id);

  // RFC 8446 fixes some legacy values. Check them.
  if (out->legacy_version != expected_version ||  //
      out->compression_method != 0 ||
      Span<const uint8_t>(out->session_id) != expected_session_id ||
      CBS_len(&out->extensions) == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  return true;
}